

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O1

Vector16 * __thiscall
iDynTree::RigidBodyInertiaNonLinearParametrization::asVectorWithRotationAsVec
          (RigidBodyInertiaNonLinearParametrization *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  Vector16 *in_RDI;
  
  dVar16 = (this->com).super_Vector3.m_data[0];
  in_RDI->m_data[0] = this->mass;
  in_RDI->m_data[1] = dVar16;
  dVar16 = (this->com).super_Vector3.m_data[2];
  in_RDI->m_data[2] = (this->com).super_Vector3.m_data[1];
  in_RDI->m_data[3] = dVar16;
  uVar1 = *(undefined4 *)((long)(this->link_R_centroidal).super_Matrix3x3.m_data + 4);
  uVar2 = *(undefined4 *)((this->link_R_centroidal).super_Matrix3x3.m_data + 1);
  uVar3 = *(undefined4 *)((long)(this->link_R_centroidal).super_Matrix3x3.m_data + 0xc);
  uVar4 = *(undefined4 *)((this->link_R_centroidal).super_Matrix3x3.m_data + 2);
  uVar5 = *(undefined4 *)((long)(this->link_R_centroidal).super_Matrix3x3.m_data + 0x14);
  uVar6 = *(undefined4 *)((this->link_R_centroidal).super_Matrix3x3.m_data + 3);
  uVar7 = *(undefined4 *)((long)(this->link_R_centroidal).super_Matrix3x3.m_data + 0x1c);
  uVar8 = *(undefined4 *)((this->link_R_centroidal).super_Matrix3x3.m_data + 4);
  uVar9 = *(undefined4 *)((long)(this->link_R_centroidal).super_Matrix3x3.m_data + 0x24);
  uVar10 = *(undefined4 *)((this->link_R_centroidal).super_Matrix3x3.m_data + 5);
  uVar11 = *(undefined4 *)((long)(this->link_R_centroidal).super_Matrix3x3.m_data + 0x2c);
  uVar12 = *(undefined4 *)((this->link_R_centroidal).super_Matrix3x3.m_data + 6);
  uVar13 = *(undefined4 *)((long)(this->link_R_centroidal).super_Matrix3x3.m_data + 0x34);
  uVar14 = *(undefined4 *)((this->link_R_centroidal).super_Matrix3x3.m_data + 7);
  uVar15 = *(undefined4 *)((long)(this->link_R_centroidal).super_Matrix3x3.m_data + 0x3c);
  *(undefined4 *)(in_RDI->m_data + 4) =
       *(undefined4 *)(this->link_R_centroidal).super_Matrix3x3.m_data;
  *(undefined4 *)((long)in_RDI->m_data + 0x24) = uVar1;
  *(undefined4 *)(in_RDI->m_data + 5) = uVar6;
  *(undefined4 *)((long)in_RDI->m_data + 0x2c) = uVar7;
  *(undefined4 *)(in_RDI->m_data + 6) = uVar12;
  *(undefined4 *)((long)in_RDI->m_data + 0x34) = uVar13;
  *(undefined4 *)(in_RDI->m_data + 7) = uVar2;
  *(undefined4 *)((long)in_RDI->m_data + 0x3c) = uVar3;
  *(undefined4 *)(in_RDI->m_data + 8) = uVar8;
  *(undefined4 *)((long)in_RDI->m_data + 0x44) = uVar9;
  *(undefined4 *)(in_RDI->m_data + 9) = uVar14;
  *(undefined4 *)((long)in_RDI->m_data + 0x4c) = uVar15;
  *(undefined4 *)(in_RDI->m_data + 10) = uVar4;
  *(undefined4 *)((long)in_RDI->m_data + 0x54) = uVar5;
  *(undefined4 *)(in_RDI->m_data + 0xb) = uVar10;
  *(undefined4 *)((long)in_RDI->m_data + 0x5c) = uVar11;
  dVar16 = (this->centralSecondMomentOfMass).m_data[0];
  in_RDI->m_data[0xc] = (this->link_R_centroidal).super_Matrix3x3.m_data[8];
  in_RDI->m_data[0xd] = dVar16;
  dVar16 = (this->centralSecondMomentOfMass).m_data[2];
  in_RDI->m_data[0xe] = (this->centralSecondMomentOfMass).m_data[1];
  in_RDI->m_data[0xf] = dVar16;
  return in_RDI;
}

Assistant:

Vector16 RigidBodyInertiaNonLinearParametrization::asVectorWithRotationAsVec() const
{
    using namespace Eigen;

    Vector16 vectorization;

    vectorization(0) = this->mass;

    vectorization(1) = this->com(0);
    vectorization(2) = this->com(1);
    vectorization(3) = this->com(2);

    Map< Matrix<double, 9, 1> >(vectorization.data()+4) = vecColMajor(toEigen(this->link_R_centroidal));

    vectorization(13) = this->centralSecondMomentOfMass(0);
    vectorization(14) = this->centralSecondMomentOfMass(1);
    vectorization(15) = this->centralSecondMomentOfMass(2);



    return vectorization;
}